

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_0::LocationValidator::validateSingleVariable
          (LocationValidator *this,
          vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
          *path,string *resource,GLint propValue,string *implementationName)

{
  ostringstream *poVar1;
  ostringstream *this_00;
  pointer pVVar2;
  TestContext *pTVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  InterfaceBlock *pIVar7;
  undefined4 extraout_var;
  undefined8 *puVar8;
  long *plVar9;
  Storage SVar10;
  pointer pVVar11;
  char *pcVar12;
  long *plVar13;
  int iVar14;
  Storage SVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  bool bVar19;
  bool bVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string elementResourceName;
  string reasonStr;
  string arrayResourceName;
  undefined4 local_2ac;
  long *local_278;
  undefined8 local_270;
  long local_268;
  undefined8 uStack_260;
  ulong *local_258;
  long local_250;
  ulong local_248 [2];
  long *local_238;
  long local_230;
  long local_228;
  long lStack_220;
  char *local_218;
  long local_210;
  char local_208;
  undefined7 uStack_207;
  ulong local_1f8;
  ulong *local_1f0;
  long local_1e8;
  ulong local_1e0 [2];
  long *local_1d0;
  long local_1c8;
  long local_1c0 [2];
  undefined1 local_1b0 [16];
  TestLog local_1a0 [12];
  ios_base local_140 [8];
  ios_base local_138 [264];
  
  pVVar2 = (path->
           super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
           )._M_impl.super__Vector_impl_data._M_start;
  iVar5 = (((path->
            super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
            )._M_impl.super__Vector_impl_data._M_finish[-1].m_data.block)->layout).offset;
  if (pVVar2->m_type == TYPE_INTERFACEBLOCK) {
    pIVar7 = (pVVar2->m_data).block;
    SVar15 = pIVar7->storage;
    iVar14 = *(int *)&(this->super_SingleVariableValidator).super_PropValidator.field_0x2c;
    bVar19 = iVar14 != 1;
    bVar20 = iVar14 != 2;
    if (STORAGE_PATCH_OUT < SVar15) {
LAB_0158fcf9:
      pIVar7 = pVVar2[1].m_data.block;
      SVar10 = pIVar7->memoryAccessQualifierFlags;
      goto LAB_0158f764;
    }
    if ((99U >> (SVar15 & 0x1f) & 1) != 0) {
      iVar14 = (pIVar7->layout).location;
      pVVar11 = (pIVar7->variables).
                super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      lVar6 = *(long *)&(pIVar7->variables).
                        super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                        ._M_impl;
      if (0 < (int)((ulong)((long)pVVar11 - lVar6) >> 5) * -0x55555555) {
        lVar17 = 0;
        lVar18 = 0;
        do {
          if (*(int *)(lVar6 + lVar17) != -1) {
            iVar14 = *(int *)(lVar6 + lVar17);
          }
          if ((VarType *)(lVar6 + lVar17) ==
              (path->
              super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
              )._M_impl.super__Vector_impl_data._M_start[1].m_data.type) break;
          if (iVar14 == -1) {
            iVar14 = -1;
          }
          else {
            iVar4 = getVariableLocationLength((VarType *)(lVar6 + lVar17 + 0x20));
            iVar14 = iVar14 + iVar4;
            lVar6 = *(long *)&(pIVar7->variables).
                              super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                              ._M_impl;
            pVVar11 = (pIVar7->variables).
                      super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
          lVar18 = lVar18 + 1;
          lVar17 = lVar17 + 0x60;
        } while (lVar18 < (int)((ulong)((long)pVVar11 - lVar6) >> 5) * -0x55555555);
      }
      iVar14 = getIOSubVariableLocation(path,2,iVar14);
      goto LAB_0158f79b;
    }
    if (SVar15 != STORAGE_UNIFORM) goto LAB_0158fcf9;
    local_218 = &local_208;
    local_210 = 0;
    local_208 = '\0';
    if (iVar5 == 0x54) goto LAB_0158f7bc;
    std::__cxx11::string::_M_replace((ulong)&local_218,0,(char *)0x0,0x1c74e27);
LAB_0158f9f7:
    local_1b0._0_8_ = ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Verifying uniform location, expecting -1. (",0x2b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,local_218,local_210);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    if (propValue == -1) goto LAB_0158fb5b;
    local_1b0._0_8_ = ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tError, got ",0xc);
    std::ostream::operator<<(poVar1,propValue);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    local_1b0._0_8_ = local_1a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"resource location invalid","");
    pTVar3 = (this->super_SingleVariableValidator).super_PropValidator.m_testCtx;
    if (pTVar3->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(pTVar3,QP_TEST_RESULT_FAIL,(char *)local_1b0._0_8_);
    }
  }
  else {
    iVar14 = *(int *)&(this->super_SingleVariableValidator).super_PropValidator.field_0x2c;
    bVar19 = iVar14 != 1;
    bVar20 = iVar14 != 2;
    pIVar7 = (pVVar2->m_data).block;
    SVar15 = pIVar7->memoryAccessQualifierFlags;
    SVar10 = SVar15;
LAB_0158f764:
    iVar14 = -1;
    if (SVar10 < STORAGE_LAST) {
      if ((99U >> (SVar10 & 0x1f) & 1) == 0) {
        if (SVar10 == STORAGE_UNIFORM) {
          iVar14 = (pIVar7->layout).location;
        }
      }
      else {
        iVar14 = getIOSubVariableLocation(path,1,(pIVar7->layout).location);
      }
    }
LAB_0158f79b:
    local_218 = &local_208;
    local_210 = 0;
    local_208 = '\0';
    if (iVar5 == 0x54) {
LAB_0158f7bc:
      local_218 = &local_208;
      local_208 = '\0';
      local_210 = 0;
      std::__cxx11::string::_M_replace((ulong)&local_218,0,(char *)0x0,0x1c74df1);
      goto LAB_0158f9f7;
    }
    switch((ulong)SVar15) {
    case 0:
    case 5:
      if ((bool)(bVar19 & iVar14 == -1)) {
        pcVar12 = 
        "Inputs (except for vertex shader inputs) not declared with a location layout qualifier have effective location of -1"
        ;
LAB_0158f9e6:
        std::__cxx11::string::_M_replace((ulong)&local_218,0,(char *)0x0,(ulong)pcVar12);
        goto LAB_0158f9f7;
      }
      if (((bool)(SVar15 == STORAGE_OUT & bVar20)) && (iVar14 == -1)) goto LAB_0158f9d9;
      break;
    case 1:
    case 6:
      if ((bool)(bVar20 & iVar14 == -1)) {
LAB_0158f9d9:
        pcVar12 = 
        "Outputs (except for fragment shader outputs) not declared with a location layout qualifier have effective location of -1"
        ;
        goto LAB_0158f9e6;
      }
    }
    if (iVar14 == -1) {
      local_1b0._0_8_ = ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log
      ;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Verifying location, expecting a valid location",0x2e);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      if (propValue != -1) goto LAB_0158fbf6;
LAB_0158f8b5:
      local_1b0._0_8_ = ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log
      ;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tError, got ",0xc);
      std::ostream::operator<<(poVar1,propValue);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      local_1b0._0_8_ = local_1a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b0,"resource location invalid","");
      pTVar3 = (this->super_SingleVariableValidator).super_PropValidator.m_testCtx;
      if (pTVar3->m_testResult == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(pTVar3,QP_TEST_RESULT_FAIL,(char *)local_1b0._0_8_);
      }
    }
    else {
      local_1b0._0_8_ = ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log
      ;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Verifying location, expecting ",0x1e);
      std::ostream::operator<<(poVar1,iVar14);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      if (iVar14 != propValue) goto LAB_0158f8b5;
LAB_0158fbf6:
      pVVar2 = (path->
               super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_1f8 = (long)(path->
                        super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2;
      if ((local_1f8 < 0x11) || (*(int *)((long)pVVar2 + (local_1f8 - 0x18)) != 0)) {
        bVar19 = false;
      }
      else {
        bVar19 = **(int **)((long)pVVar2 + (local_1f8 - 0x20)) == 1;
      }
      iVar5 = (*((this->super_SingleVariableValidator).super_PropValidator.m_renderContext)->
                _vptr_RenderContext[3])();
      local_2ac = 0;
      if (SVar15 < STORAGE_LAST) {
        local_2ac = *(undefined4 *)(&DAT_01c747e0 + (ulong)SVar15 * 4);
      }
      local_1b0._0_8_ = ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log
      ;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "Comparing location to the values returned by GetProgramResourceLocation",0x47);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      if (bVar19) {
        if (implementationName->_M_string_length < 4) {
          local_1d0 = local_1c0;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,0x1af8059);
        }
        else {
          std::__cxx11::string::substr((ulong)&local_1d0,(ulong)implementationName);
        }
        if (0 < *(int *)(*(long *)((long)&pVVar2[-2].m_data + local_1f8) + 0x10)) {
          poVar1 = (ostringstream *)(local_1b0 + 8);
          this_00 = (ostringstream *)(local_1b0 + 8);
          iVar14 = 0;
          do {
            local_258 = local_248;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_258,local_1d0,local_1c8 + (long)local_1d0);
            std::__cxx11::string::append((char *)&local_258);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
            std::ostream::operator<<((ostringstream *)local_1b0,iVar14);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
            std::ios_base::~ios_base(local_140);
            uVar16 = 0xf;
            if (local_258 != local_248) {
              uVar16 = local_248[0];
            }
            if (uVar16 < (ulong)(local_1e8 + local_250)) {
              uVar16 = 0xf;
              if (local_1f0 != local_1e0) {
                uVar16 = local_1e0[0];
              }
              if (uVar16 < (ulong)(local_1e8 + local_250)) goto LAB_0158ff5a;
              puVar8 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_1f0,0,(char *)0x0,(ulong)local_258);
            }
            else {
LAB_0158ff5a:
              puVar8 = (undefined8 *)
                       std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_1f0);
            }
            local_278 = &local_268;
            plVar9 = puVar8 + 2;
            if ((long *)*puVar8 == plVar9) {
              local_268 = *plVar9;
              uStack_260 = puVar8[3];
            }
            else {
              local_268 = *plVar9;
              local_278 = (long *)*puVar8;
            }
            local_270 = puVar8[1];
            *puVar8 = plVar9;
            puVar8[1] = 0;
            *(undefined1 *)plVar9 = 0;
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_278);
            local_238 = &local_228;
            plVar13 = plVar9 + 2;
            if ((long *)*plVar9 == plVar13) {
              local_228 = *plVar13;
              lStack_220 = plVar9[3];
            }
            else {
              local_228 = *plVar13;
              local_238 = (long *)*plVar9;
            }
            local_230 = plVar9[1];
            *plVar9 = (long)plVar13;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            if (local_278 != &local_268) {
              operator_delete(local_278,local_268 + 1);
            }
            if (local_1f0 != local_1e0) {
              operator_delete(local_1f0,local_1e0[0] + 1);
            }
            if (local_258 != local_248) {
              operator_delete(local_258,local_248[0] + 1);
            }
            iVar4 = (**(code **)(CONCAT44(extraout_var,iVar5) + 0x9b0))
                              ((this->super_SingleVariableValidator).m_programID,local_2ac,local_238
                              );
            if (propValue + iVar14 == iVar4) {
              local_1b0._0_8_ =
                   ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log;
              std::__cxx11::ostringstream::ostringstream(this_00);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_00,"\tLocation of \"",0xe);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_00,(char *)local_238,local_230);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\":\t",3);
              std::ostream::operator<<(this_00,iVar4);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(this_00);
              std::ios_base::~ios_base(local_138);
            }
            else {
              local_1b0._0_8_ =
                   ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log;
              std::__cxx11::ostringstream::ostringstream(poVar1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,"\tError, getProgramResourceLocation (resource=\"",0x2e);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,(char *)local_238,local_230);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,"\") returned location ",0x15);
              std::ostream::operator<<(poVar1,iVar4);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,", expected ",0xb);
              std::ostream::operator<<(poVar1,propValue + iVar14);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(poVar1);
              std::ios_base::~ios_base(local_138);
              local_1b0._0_8_ = local_1a0;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1b0,"resource location invalid","");
              pTVar3 = (this->super_SingleVariableValidator).super_PropValidator.m_testCtx;
              if (pTVar3->m_testResult == QP_TEST_RESULT_PASS) {
                tcu::TestContext::setTestResult(pTVar3,QP_TEST_RESULT_FAIL,(char *)local_1b0._0_8_);
              }
              if ((TestLog *)local_1b0._0_8_ != local_1a0) {
                operator_delete((void *)local_1b0._0_8_,
                                (ulong)((long)&(local_1a0[0].m_log)->flags + 1));
              }
            }
            if (local_238 != &local_228) {
              operator_delete(local_238,local_228 + 1);
            }
            iVar14 = iVar14 + 1;
          } while (iVar14 < *(int *)(*(long *)((long)&pVVar2[-2].m_data + local_1f8) + 0x10));
        }
        if (local_1d0 != local_1c0) {
          operator_delete(local_1d0,local_1c0[0] + 1);
        }
        goto LAB_0158fb5b;
      }
      iVar5 = (**(code **)(CONCAT44(extraout_var,iVar5) + 0x9b0))
                        ((this->super_SingleVariableValidator).m_programID,local_2ac,
                         (implementationName->_M_dataplus)._M_p);
      if (iVar5 == propValue) goto LAB_0158fb5b;
      local_1b0._0_8_ = ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log
      ;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"\tError, getProgramResourceLocation returned location ",0x35);
      std::ostream::operator<<(poVar1,iVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected ",0xb);
      std::ostream::operator<<(poVar1,propValue);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      local_1b0._0_8_ = local_1a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b0,"resource location invalid","");
      pTVar3 = (this->super_SingleVariableValidator).super_PropValidator.m_testCtx;
      if (pTVar3->m_testResult == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(pTVar3,QP_TEST_RESULT_FAIL,(char *)local_1b0._0_8_);
      }
    }
  }
  if ((TestLog *)local_1b0._0_8_ != local_1a0) {
    operator_delete((void *)local_1b0._0_8_,(ulong)((long)&(local_1a0[0].m_log)->flags + 1));
  }
LAB_0158fb5b:
  if (local_218 != &local_208) {
    operator_delete(local_218,CONCAT71(uStack_207,local_208) + 1);
  }
  return;
}

Assistant:

void LocationValidator::validateSingleVariable (const std::vector<VariablePathComponent>& path, const std::string& resource, glw::GLint propValue, const std::string& implementationName) const
{
	const bool			isAtomicCounterUniform	= glu::isDataTypeAtomicCounter(path.back().getVariableType()->getBasicType());
	const bool			isUniformBlockVariable	= path.front().isInterfaceBlock() && path.front().getInterfaceBlock()->storage == glu::STORAGE_UNIFORM;
	const bool			isVertexShader			= m_filter.getShaderTypeBits() == (1u << glu::SHADERTYPE_VERTEX);
	const bool			isFragmentShader		= m_filter.getShaderTypeBits() == (1u << glu::SHADERTYPE_FRAGMENT);
	const glu::Storage	storage					= (path.front().isInterfaceBlock()) ? (path.front().getInterfaceBlock()->storage) : (path.front().getDeclaration()->storage);
	const bool			isInputVariable			= (storage == glu::STORAGE_IN || storage == glu::STORAGE_PATCH_IN);
	const bool			isOutputVariable		= (storage == glu::STORAGE_OUT || storage == glu::STORAGE_PATCH_OUT);
	const int			explicitLayoutLocation	= getExplicitLocationFromPath(path);

	bool				expectLocation;
	std::string			reasonStr;

	DE_UNREF(resource);

	if (isAtomicCounterUniform)
	{
		expectLocation = false;
		reasonStr = "Atomic counter uniforms have effective location of -1";
	}
	else if (isUniformBlockVariable)
	{
		expectLocation = false;
		reasonStr = "Uniform block variables have effective location of -1";
	}
	else if (isInputVariable && !isVertexShader && explicitLayoutLocation == -1)
	{
		expectLocation = false;
		reasonStr = "Inputs (except for vertex shader inputs) not declared with a location layout qualifier have effective location of -1";
	}
	else if (isOutputVariable && !isFragmentShader && explicitLayoutLocation == -1)
	{
		expectLocation = false;
		reasonStr = "Outputs (except for fragment shader outputs) not declared with a location layout qualifier have effective location of -1";
	}
	else
	{
		expectLocation = true;
	}

	if (!expectLocation)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying uniform location, expecting -1. (" << reasonStr << ")" << tcu::TestLog::EndMessage;

		if (propValue != -1)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "\tError, got " << propValue << tcu::TestLog::EndMessage;
			setError("resource location invalid");
		}
	}
	else
	{
		bool locationOk;

		if (explicitLayoutLocation == -1)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Verifying location, expecting a valid location" << tcu::TestLog::EndMessage;
			locationOk = (propValue != -1);
		}
		else
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Verifying location, expecting " << explicitLayoutLocation << tcu::TestLog::EndMessage;
			locationOk = (propValue == explicitLayoutLocation);
		}

		if (!locationOk)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "\tError, got " << propValue << tcu::TestLog::EndMessage;
			setError("resource location invalid");
		}
		else
		{
			const VariablePathComponent		nullComponent;
			const VariablePathComponent&	enclosingcomponent	= (path.size() > 1) ? (path[path.size()-2]) : (nullComponent);
			const bool						isArray				= enclosingcomponent.isVariableType() && enclosingcomponent.getVariableType()->isArrayType();

			const glw::Functions&			gl					= m_renderContext.getFunctions();
			const glw::GLenum				interface			= getProgramDefaultBlockInterfaceFromStorage(storage);

			m_testCtx.getLog() << tcu::TestLog::Message << "Comparing location to the values returned by GetProgramResourceLocation" << tcu::TestLog::EndMessage;

			// Test all bottom-level array elements
			if (isArray)
			{
				const std::string arrayResourceName = (implementationName.size() > 3) ? (implementationName.substr(0, implementationName.size() - 3)) : (""); // chop "[0]"

				for (int arrayElementNdx = 0; arrayElementNdx < enclosingcomponent.getVariableType()->getArraySize(); ++arrayElementNdx)
				{
					const std::string	elementResourceName	= arrayResourceName + "[" + de::toString(arrayElementNdx) + "]";
					const glw::GLint	location			= gl.getProgramResourceLocation(m_programID, interface, elementResourceName.c_str());

					if (location != propValue+arrayElementNdx)
					{
						m_testCtx.getLog()
							<< tcu::TestLog::Message
							<< "\tError, getProgramResourceLocation (resource=\"" << elementResourceName << "\") returned location " << location
							<< ", expected " << (propValue+arrayElementNdx)
							<< tcu::TestLog::EndMessage;
						setError("resource location invalid");
					}
					else
						m_testCtx.getLog() << tcu::TestLog::Message << "\tLocation of \"" << elementResourceName << "\":\t" << location << tcu::TestLog::EndMessage;
				}
			}
			else
			{
				const glw::GLint location = gl.getProgramResourceLocation(m_programID, interface, implementationName.c_str());

				if (location != propValue)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "\tError, getProgramResourceLocation returned location " << location << ", expected " << propValue << tcu::TestLog::EndMessage;
					setError("resource location invalid");
				}
			}

		}
	}
}